

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::Pop(ScriptContext *scriptContext,Var object)

{
  bool bVar1;
  JavascriptArray *arr;
  Var pvVar2;
  
  bVar1 = IsNonES5Array(object);
  if (bVar1) {
    arr = VarTo<Js::JavascriptArray>(object);
    pvVar2 = EntryPopJavascriptArray(scriptContext,arr);
    return pvVar2;
  }
  pvVar2 = EntryPopNonJavascriptArray(scriptContext,object);
  return pvVar2;
}

Assistant:

Var JavascriptArray::Pop(ScriptContext * scriptContext, Var object)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_VarPop);
        if (JavascriptArray::IsNonES5Array(object))
        {
            return EntryPopJavascriptArray(scriptContext, VarTo<JavascriptArray>(object));
        }
        else
        {
            return EntryPopNonJavascriptArray(scriptContext, object);
        }
        JIT_HELPER_END(Array_VarPop);
    }